

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O3

void tcp_dial_con_cb(void *arg)

{
  nni_aio *aio;
  nng_err result;
  nni_aio *aio_00;
  nng_stream *pnVar1;
  void *data;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x588));
  aio = (nni_aio *)((long)arg + 0x3a8);
  result = nni_aio_result(aio);
  if (*(char *)((long)arg + 0x148) == '\0') {
    aio_00 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x570));
    if (aio_00 != (nni_aio *)0x0) {
      nni_list_remove((nni_list *)((long)arg + 0x570),aio_00);
      if (result == NNG_OK) {
        data = nni_aio_get_output(aio,0);
        nni_aio_set_output(aio_00,0,data);
        nni_aio_finish(aio_00,NNG_OK,0);
      }
      else {
        nni_aio_finish_error(aio_00,result);
      }
      tcp_dial_start_next((tcp_dialer *)arg);
      goto LAB_001304dc;
    }
  }
  if (result == NNG_OK) {
    pnVar1 = (nng_stream *)nni_aio_get_output(aio,0);
    nng_stream_close(pnVar1);
    pnVar1 = (nng_stream *)nni_aio_get_output(aio,0);
    nng_stream_stop(pnVar1);
    pnVar1 = (nng_stream *)nni_aio_get_output(aio,0);
    nng_stream_free(pnVar1);
    nni_aio_set_output(aio,0,(void *)0x0);
  }
LAB_001304dc:
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x588));
  return;
}

Assistant:

static void
tcp_dial_con_cb(void *arg)
{
	tcp_dialer *d = arg;
	nng_aio    *aio;
	int         rv;

	nni_mtx_lock(&d->mtx);
	rv = nni_aio_result(&d->conaio);
	if ((d->closed) || ((aio = nni_list_first(&d->conaios)) == NULL)) {
		if (rv == 0) {
			// Make sure we discard the underlying connection.
			nng_stream_close(nni_aio_get_output(&d->conaio, 0));
			nng_stream_stop(nni_aio_get_output(&d->conaio, 0));
			nng_stream_free(nni_aio_get_output(&d->conaio, 0));
			nni_aio_set_output(&d->conaio, 0, NULL);
		}
		nni_mtx_unlock(&d->mtx);
		return;
	}
	nni_list_remove(&d->conaios, aio);
	if (rv != 0) {
		nni_aio_finish_error(aio, rv);
	} else {
		nni_aio_set_output(aio, 0, nni_aio_get_output(&d->conaio, 0));
		nni_aio_finish(aio, 0, 0);
	}

	tcp_dial_start_next(d);
	nni_mtx_unlock(&d->mtx);
}